

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Infector_single.hpp
# Opt level: O2

shared_ptr<KaaaVS> __thiscall Infector::Container::buildSingle_delegate<KaaaVS>(Container *this)

{
  long *plVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  iterator iVar3;
  iterator iVar4;
  iterator iVar5;
  type_info *ptVar6;
  void *pvVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Container *in_RSI;
  shared_ptr<KaaaVS> sVar8;
  key_type local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  undefined1 local_38 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  local_48._M_target = (type_info *)&KaaaVS::typeinfo;
  iVar3 = std::
          _Hashtable<std::type_index,_std::pair<const_std::type_index,_Infector::Container::Binding>,_std::allocator<std::pair<const_std::type_index,_Infector::Container::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(in_RSI->typeMap)._M_h,&local_48);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_std::type_index,_Infector::Container::Binding>,_false>
      ._M_cur == (__node_type *)0x0) {
    launch_exception<Infector::ExBuildWhat>(in_RSI);
  }
  if (*(char *)((long)iVar3.
                      super__Node_iterator_base<std::pair<const_std::type_index,_Infector::Container::Binding>,_false>
                      ._M_cur + 0x18) == '\0') {
    launch_exception<Infector::ExSingleMulti>(in_RSI);
  }
  iVar4 = std::
          _Hashtable<std::type_index,_std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>,_std::allocator<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(in_RSI->callbacks)._M_h,
                 (key_type *)
                 ((long)iVar3.
                        super__Node_iterator_base<std::pair<const_std::type_index,_Infector::Container::Binding>,_false>
                        ._M_cur + 0x10));
  if (iVar4.
      super__Node_iterator_base<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    launch_exception<Infector::ExNotWired>(in_RSI);
  }
  iVar5 = std::
          _Hashtable<std::type_index,_std::pair<const_std::type_index,_Infector::IAnyShared_*>,_std::allocator<std::pair<const_std::type_index,_Infector::IAnyShared_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<std::type_index,_std::pair<const_std::type_index,_Infector::IAnyShared_*>,_std::allocator<std::pair<const_std::type_index,_Infector::IAnyShared_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)in_RSI,
                 (key_type *)
                 ((long)iVar3.
                        super__Node_iterator_base<std::pair<const_std::type_index,_Infector::Container::Binding>,_false>
                        ._M_cur + 0x10));
  plVar1 = *(long **)((long)iVar5.
                            super__Node_iterator_base<std::pair<const_std::type_index,_Infector::IAnyShared_*>,_false>
                            ._M_cur + 0x10);
  ptVar6 = (type_info *)(**(code **)*plVar1)(plVar1);
  if (ptVar6 == (type_info *)0x0) {
    pvVar7 = std::function<void_*(Infector::Container::EmplaceContext_*)>::operator()
                       ((function<void_*(Infector::Container::EmplaceContext_*)> *)
                        ((long)iVar4.
                               super__Node_iterator_base<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>,_false>
                               ._M_cur + 0x10),(EmplaceContext *)0x0);
    (**(code **)(*plVar1 + 8))(plVar1,pvVar7);
    ptVar6 = (type_info *)(**(code **)*plVar1)(plVar1,&KaaaVS::typeinfo);
    if (ptVar6 == (type_info *)0x0) {
      launch_exception<Infector::ExAnySharedNullPtr>(in_RSI);
      ptVar6 = (type_info *)0x0;
    }
  }
  (**(code **)(*plVar1 + 0x10))(local_38,plVar1);
  local_48._M_target = ptVar6;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count(&_Stack_40,&local_30);
  _Var2._M_pi = _Stack_40._M_pi;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->singleIstances)._M_h._M_buckets = (__buckets_ptr)local_48._M_target;
  (this->singleIstances)._M_h._M_bucket_count = (size_type)_Var2._M_pi;
  local_48._M_target = (type_info *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  sVar8.super___shared_ptr<KaaaVS,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar8.super___shared_ptr<KaaaVS,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<KaaaVS>)sVar8.super___shared_ptr<KaaaVS,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> Container::buildSingle_delegate(){
        auto it = typeMap.find( std::type_index(typeid(T)) );
        if( it==typeMap.end()) //"it" is concrete type, T abstract one
            launch_exception<ExBuildWhat>(); // TYPE NOT REGISTERED

        if( it->second.single == false)
            launch_exception<ExSingleMulti>(); // T must be single

        //at this point may happen that concrete type and abstract ones are the
        //same.that's ok. (bindSingleAsNothing)
        auto it2 = callbacks.find(  it->second.type ); //find constructor

        if( it2==callbacks.end())
            launch_exception<ExNotWired>(); // CONSTRUCTOR NOT WIRED

        auto it3 = singleIstances.find( it->second.type );

        IAnyShared * any = it3->second;
        T* myPointer = reinterpret_cast<T*>(
                                    any->getPtr(std::type_index(typeid(T)))
                                            );
        if(myPointer==nullptr){
            try{
                any->setPtr( (it2->second)(nullptr) );
                myPointer =  reinterpret_cast<T*>(
                                    any->getPtr(std::type_index(typeid(T)))
                                            );

            }catch(std::exception & ex){
                throw ex;
            }catch(...){
                launch_exception<ExUnkownException>();
            }
        }

        if(myPointer == nullptr)
                launch_exception<ExAnySharedNullPtr>();

        return std::move(std::shared_ptr<T> (
                                any->getReferenceCounter(),
                                myPointer ));
    }